

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::detail::formatTruncated<short>(ostream *out,short *value,int ntrunc)

{
  long lVar1;
  short *in_RSI;
  char *in_RDI;
  string result;
  ostringstream tmp;
  int local_1c4;
  string local_1c0 [48];
  ostringstream local_190 [380];
  int local_14;
  short *local_10;
  char *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::operator<<(local_190,*local_10);
  std::__cxx11::ostringstream::str();
  lVar1 = std::__cxx11::string::c_str();
  local_1c4 = std::__cxx11::string::size();
  std::min<int>(&local_14,&local_1c4);
  std::ostream::write(local_8,lVar1);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

inline void formatTruncated(std::ostream& out, const T& value, int ntrunc)
{
    std::ostringstream tmp;
    tmp << value;
    std::string result = tmp.str();
    out.write(result.c_str(), (std::min)(ntrunc, static_cast<int>(result.size())));
}